

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

MVECTOR<float> * CCEXP::getRow<float>(CCEXP *obj,char *matname,size_t row)

{
  size_t sel;
  MVECTOR<float> *pMVar1;
  
  obj->ErrorId = 0;
  sel = CCEXP::getTableIndexByName(obj,matname);
  if (sel != 0xffffffffffffffff) {
    pMVar1 = getRow<float>(obj,sel,row);
    return pMVar1;
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x33d,
                 "[%s]: getRow():: Failed to find table with name [%s]!",obj->SavingFile,matname);
  return (MVECTOR<float> *)0x0;
}

Assistant:

inline MVECTOR<T>* getRow(
	CCEXP &obj, const char* matname, size_t row
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERRN(CCEXPECS,sel == MAXSIZE_T,"[%s]: getRow():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	MVECTOR<T>* vret = getRow<T>(obj, sel, row);
	return vret;
}